

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O3

INode * __thiscall
COLLADASaxFWL::FormulasLoader::createLogicOperation
          (FormulasLoader *this,NodeVector *nodes,Operator op)

{
  LogicExpression *this_00;
  pointer ppIVar1;
  ulong uVar2;
  
  if (op - AND < 3) {
    this_00 = (LogicExpression *)operator_new(0x28);
    MathML::AST::LogicExpression::LogicExpression(this_00);
    (*(this_00->super_INode)._vptr_INode[6])(this_00,(ulong)(op - AND));
    ppIVar1 = (nodes->
              super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((nodes->super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>).
        _M_impl.super__Vector_impl_data._M_finish != ppIVar1) {
      uVar2 = 0;
      do {
        (*(this_00->super_INode)._vptr_INode[0xb])(this_00,ppIVar1[uVar2]);
        uVar2 = uVar2 + 1;
        ppIVar1 = (nodes->
                  super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar2 < (ulong)((long)(nodes->
                                     super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1 >>
                              3));
    }
  }
  else {
    this_00 = (LogicExpression *)0x0;
  }
  return &this_00->super_INode;
}

Assistant:

MathML::AST::INode* FormulasLoader::createLogicOperation( const NodeVector& nodes, Operator op )
	{
		MathML::AST::LogicExpression::Operator mmlOp;
		switch ( op )
		{
		case AND:
			mmlOp = MathML::AST::LogicExpression::AND;
			break;
		case OR:
			mmlOp = MathML::AST::LogicExpression::OR;
			break;
		case XOR:
			mmlOp = MathML::AST::LogicExpression::XOR;
			break;
		default:
			// invalid operator
			return 0;
		}

		MathML::AST::LogicExpression* expression = new MathML::AST::LogicExpression();
		expression->setOperator( mmlOp );
		for (size_t i=0; i<nodes.size(); ++i)
		{
			expression->addOperand( nodes[ i ] );
		}

		return expression;
	}